

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O3

Result wabt::ApplyNames(Module *module)

{
  Var *var;
  Func *func;
  pointer pTVar1;
  pointer pTVar2;
  char *pcVar3;
  ElemSegment *pEVar4;
  pointer pEVar5;
  DataSegment *pDVar6;
  Result RVar7;
  Index IVar8;
  pointer ppFVar9;
  pointer ppGVar10;
  pointer ppEVar11;
  Var *pVVar12;
  pointer ppEVar13;
  pointer ppDVar14;
  Memory *pMVar15;
  pointer ppVVar16;
  pointer ppEVar17;
  Var *var_00;
  ElemExpr *elem_expr;
  pointer pEVar18;
  Enum EVar19;
  ulong uVar20;
  string_view name;
  NameApplier applier;
  Delegate local_c8;
  Module *local_c0;
  Func *pFStack_b8;
  ExprVisitor local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_48;
  
  local_c8._vptr_Delegate = (_func_int **)&PTR__NameApplier_001a80b0;
  local_c0 = (Module *)0x0;
  pFStack_b8 = (Func *)0x0;
  ExprVisitor::ExprVisitor(&local_b0,&local_c8);
  vStack_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppFVar9 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_c0 = module;
  if ((module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar9) {
    uVar20 = 0;
    do {
      func = ppFVar9[uVar20];
      pFStack_b8 = func;
      if ((func->decl).has_func_type == true) {
        RVar7 = anon_unknown_11::NameApplier::UseNameForFuncTypeVar
                          ((NameApplier *)local_c0,&(func->decl).type_var);
        if (RVar7.enum_ == Error) goto LAB_0014a74a;
      }
      pTVar1 = (func->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar2 = (func->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      IVar8 = LocalTypes::size(&func->local_types);
      MakeTypeBindingReverseMapping
                ((ulong)((int)((ulong)((long)pTVar1 - (long)pTVar2) >> 2) + IVar8),&func->bindings,
                 &local_60);
      RVar7 = ExprVisitor::VisitFunc(&local_b0,func);
      if (RVar7.enum_ == Error) goto LAB_0014a74a;
      pFStack_b8 = (Func *)0x0;
      uVar20 = uVar20 + 1;
      ppFVar9 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(module->funcs).
                                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar9 >> 3))
    ;
  }
  ppGVar10 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar10) {
    uVar20 = 0;
    do {
      RVar7 = ExprVisitor::VisitExprList(&local_b0,&ppGVar10[uVar20]->init_expr);
      if (RVar7.enum_ == Error) goto LAB_0014a74a;
      uVar20 = uVar20 + 1;
      ppGVar10 = (module->globals).
                 super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(module->globals).
                                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar10 >> 3
                             ));
  }
  ppEVar11 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar17 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar17 != ppEVar11) {
    uVar20 = 0;
    do {
      if ((ppEVar11[uVar20]->decl).has_func_type == true) {
        RVar7 = anon_unknown_11::NameApplier::UseNameForFuncTypeVar
                          ((NameApplier *)local_c0,&(ppEVar11[uVar20]->decl).type_var);
        if (RVar7.enum_ == Error) goto LAB_0014a74a;
        ppEVar11 = (module->events).
                   super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppEVar17 = (module->events).
                   super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < (ulong)((long)ppEVar17 - (long)ppEVar11 >> 3));
  }
  pVVar12 = (Var *)(module->exports).
                   super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
  var_00 = (Var *)(module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
  if (var_00 != pVVar12) {
    uVar20 = 0;
    do {
      pcVar3 = (&(pVVar12->loc).filename.data_)[uVar20];
      if (*(int *)(pcVar3 + 0x20) == 0) {
        anon_unknown_11::NameApplier::UseNameForFuncVar
                  ((NameApplier *)local_c0,(Var *)(pcVar3 + 0x28));
        pVVar12 = (Var *)(module->exports).
                         super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
        var_00 = (Var *)(module->exports).
                        super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < (ulong)((long)var_00 - (long)pVVar12 >> 3));
  }
  ppEVar13 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar13) {
    pVVar12 = (Var *)0x0;
    EVar19 = Error;
    do {
      pEVar4 = ppEVar13[(long)pVVar12];
      RVar7 = anon_unknown_11::NameApplier::UseNameForTableVar
                        ((NameApplier *)local_c0,&pEVar4->table_var);
      if (RVar7.enum_ == Error) goto LAB_0014a74f;
      RVar7 = ExprVisitor::VisitExprList(&local_b0,&pEVar4->offset);
      if (RVar7.enum_ == Error) goto LAB_0014a74f;
      pEVar5 = (pEVar4->elem_exprs).
               super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pEVar18 = (pEVar4->elem_exprs).
                     super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
                     super__Vector_impl_data._M_start; pEVar18 != pEVar5; pEVar18 = pEVar18 + 1) {
        if (pEVar18->kind == RefFunc) {
          RVar7 = anon_unknown_11::NameApplier::UseNameForFuncVar
                            ((NameApplier *)local_c0,&pEVar18->var);
          if (RVar7.enum_ == Error) goto LAB_0014a74f;
        }
      }
      pVVar12 = (Var *)((long)&(pVVar12->loc).filename.data_ + 1);
      ppEVar13 = (module->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      var_00 = (Var *)((long)(module->elem_segments).
                             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar13 >> 3);
    } while (pVVar12 < var_00);
  }
  ppDVar14 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppDVar14) {
    pVVar12 = (Var *)0x0;
    EVar19 = Error;
    do {
      pDVar6 = ppDVar14[(long)pVVar12];
      var = &pDVar6->memory_var;
      pMVar15 = Module::GetMemory(local_c0,var);
      if (pMVar15 == (Memory *)0x0) goto LAB_0014a74f;
      name.size_ = (size_type)var;
      name.data_ = (char *)(pMVar15->name)._M_string_length;
      anon_unknown_11::NameApplier::UseNameForVar
                ((NameApplier *)(pMVar15->name)._M_dataplus._M_p,name,var_00);
      RVar7 = ExprVisitor::VisitExprList(&local_b0,&pDVar6->offset);
      if (RVar7.enum_ == Error) goto LAB_0014a74f;
      pVVar12 = (Var *)((long)&(pVVar12->loc).filename.data_ + 1);
      ppDVar14 = (module->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      var_00 = (Var *)((long)(module->data_segments).
                             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar14 >> 3);
    } while (pVVar12 < var_00);
  }
  ppVVar16 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar16) {
    uVar20 = 0;
    do {
      RVar7 = anon_unknown_11::NameApplier::UseNameForFuncVar
                        ((NameApplier *)local_c0,ppVVar16[uVar20]);
      if (RVar7.enum_ == Error) goto LAB_0014a74a;
      uVar20 = uVar20 + 1;
      ppVVar16 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(module->starts).
                                    super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar16 >> 3)
            );
  }
  local_c0 = (Module *)0x0;
  EVar19 = Ok;
LAB_0014a74f:
  local_c8._vptr_Delegate = (_func_int **)&PTR__NameApplier_001a80b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  if (local_b0.expr_iter_stack_.
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)EVar19;
LAB_0014a74a:
  EVar19 = Error;
  goto LAB_0014a74f;
}

Assistant:

Result ApplyNames(Module* module) {
  NameApplier applier;
  return applier.VisitModule(module);
}